

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O3

void LTWeather::FillUp(array<float,_13UL> *levels_m,array<float,_13UL> *to,float alt_m,float val,
                      bool bInterpolateNext)

{
  ulong uVar1;
  
  uVar1 = 0xffffffffffffffff;
  do {
    if (alt_m < levels_m->_M_elems[uVar1 + 1]) {
      if (!bInterpolateNext || 10 < uVar1) {
        return;
      }
      to->_M_elems[uVar1 + 1] =
           ((to->_M_elems[uVar1 + 2] - to->_M_elems[uVar1]) *
           ((float)*(undefined8 *)(levels_m->_M_elems + uVar1 + 1) - levels_m->_M_elems[uVar1])) /
           ((float)((ulong)*(undefined8 *)(levels_m->_M_elems + uVar1 + 1) >> 0x20) -
           levels_m->_M_elems[uVar1]) + to->_M_elems[uVar1];
      return;
    }
    to->_M_elems[uVar1 + 1] = val;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0xc);
  return;
}

Assistant:

void LTWeather::FillUp (const std::array<float,13>& levels_m,
                        std::array<float,13>& to,
                        float alt_m,
                        float val,
                        bool bInterpolateNext)
{
    std::size_t i = 0;
    for (; i < levels_m.size() && levels_m[i] <= alt_m; ++i)    // while level is less than alt_m set value
        to[i] = val;
    // i now points to first element _after_ those we set to 'val'
    if (bInterpolateNext && i >= 1 && i+1 < levels_m.size()) {        // to align with values above interpolate the next value
        to[i] = to[i-1] + (to[i+1]-to[i-1])*(levels_m[i]-levels_m[i-1])/(levels_m[i+1]-levels_m[i-1]);
    }
}